

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * append_str(char *zText,int n,int p1,int p2)

{
  size_t sVar1;
  uint in_ECX;
  int iVar2;
  char *pcVar3;
  long lVar4;
  uint in_EDX;
  int in_ESI;
  char *in_RDI;
  char zInt [40];
  int c;
  char acStack_48 [40];
  int local_20;
  uint local_1c;
  uint local_18;
  int local_14;
  char *local_10;
  char *local_8;
  
  if (in_RDI == (char *)0x0) {
    if ((append_str::used == 0) && (append_str::z != (char *)0x0)) {
      *append_str::z = '\0';
    }
    append_str::used = 0;
    local_8 = append_str::z;
  }
  else {
    local_1c = in_ECX;
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_ESI < 1) {
      if (in_ESI < 0) {
        append_str::used = in_ESI + append_str::used;
      }
      sVar1 = strlen(in_RDI);
      local_14 = (int)sVar1;
    }
    if (append_str::alloced <= local_14 + 0x50 + append_str::used) {
      append_str::alloced = local_14 + append_str::used + 0x118;
      append_str::z = (char *)realloc(append_str::z,(long)append_str::alloced);
    }
    if (append_str::z == (char *)0x0) {
      local_8 = append_str::empty;
    }
    else {
      while (iVar2 = local_14 + -1, 0 < local_14) {
        pcVar3 = local_10 + 1;
        local_20 = (int)*local_10;
        local_14 = iVar2;
        if (((local_20 == 0x25) && (0 < iVar2)) && (*pcVar3 == 'd')) {
          local_10 = pcVar3;
          lemon_sprintf(acStack_48,"%d",(ulong)local_18);
          local_18 = local_1c;
          lemon_strcpy(append_str::z + append_str::used,acStack_48);
          sVar1 = strlen(append_str::z + append_str::used);
          append_str::used = (int)sVar1 + append_str::used;
          local_14 = local_14 + -1;
          local_10 = local_10 + 1;
        }
        else {
          lVar4 = (long)append_str::used;
          append_str::used = append_str::used + 1;
          append_str::z[lVar4] = *local_10;
          local_10 = pcVar3;
        }
      }
      append_str::z[append_str::used] = '\0';
      local_8 = append_str::z;
    }
  }
  return local_8;
}

Assistant:

PRIVATE char *append_str(const char *zText, int n, int p1, int p2){
  static char empty[1] = { 0 };
  static char *z = 0;
  static int alloced = 0;
  static int used = 0;
  int c;
  char zInt[40];
  if( zText==0 ){
    if( used==0 && z!=0 ) z[0] = 0;
    used = 0;
    return z;
  }
  if( n<=0 ){
    if( n<0 ){
      used += n;
      assert( used>=0 );
    }
    n = lemonStrlen(zText);
  }
  if( (int) (n+sizeof(zInt)*2+used) >= alloced ){
    alloced = n + sizeof(zInt)*2 + used + 200;
    z = (char *) realloc(z,  alloced);
  }
  if( z==0 ) return empty;
  while( n-- > 0 ){
    c = *(zText++);
    if( c=='%' && n>0 && zText[0]=='d' ){
      lemon_sprintf(zInt, "%d", p1);
      p1 = p2;
      lemon_strcpy(&z[used], zInt);
      used += lemonStrlen(&z[used]);
      zText++;
      n--;
    }else{
      z[used++] = (char)c;
    }
  }
  z[used] = 0;
  return z;
}